

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O2

void residue_suite::parse_null(void)

{
  bool v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_05;
  reader *reader;
  error_code eVar1;
  string input;
  string input_6;
  basic_variable<std::allocator<char>_> result;
  type local_2b8;
  undefined4 local_27c;
  undefined8 local_278;
  undefined8 local_270;
  long local_258;
  error_category *local_250;
  basic_reader<char> local_248;
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  local_f8;
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  local_c8;
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  local_98;
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  local_68;
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8.__align,"null ",(allocator<char> *)&local_248);
  trial::protocol::json::parse<std::__cxx11::string,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&local_248,(json *)&local_2b8.__align,input_00
            );
  boost::detail::test_impl
            ("result.same<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x282,"void residue_suite::parse_null()",
             (char)local_248.decoder.current.view.tail == '\0');
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                  *)&local_248);
  std::__cxx11::string::~string((string *)&local_2b8.__align);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"null,",(allocator<char> *)&local_2b8.__align);
  trial::protocol::json::parse<std::__cxx11::string,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&local_38,(json *)&local_248,input_01);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&local_38);
  boost::detail::throw_failed_impl
            ("json::parse(input)","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x289,"void residue_suite::parse_null()");
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"null true",(allocator<char> *)&local_2b8.__align);
  trial::protocol::json::parse<std::__cxx11::string,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&local_68,(json *)&local_248,input_02);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&local_68);
  boost::detail::throw_failed_impl
            ("json::parse(input)","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x290,"void residue_suite::parse_null()");
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"null\"zulu\"",(allocator<char> *)&local_2b8.__align);
  trial::protocol::json::parse<std::__cxx11::string,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&local_98,(json *)&local_248,input_03);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&local_98);
  boost::detail::throw_failed_impl
            ("json::parse(input)","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x297,"void residue_suite::parse_null()");
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"null[]",(allocator<char> *)&local_2b8.__align);
  trial::protocol::json::parse<std::__cxx11::string,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&local_c8,(json *)&local_248,input_04);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&local_c8);
  boost::detail::throw_failed_impl
            ("json::parse(input)","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x29e,"void residue_suite::parse_null()");
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"null{}",(allocator<char> *)&local_2b8.__align);
  trial::protocol::json::parse<std::__cxx11::string,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&local_f8,(json *)&local_248,input_05);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&local_f8);
  boost::detail::throw_failed_impl
            ("json::parse(input)","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x2a5,"void residue_suite::parse_null()");
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"null[]",(allocator<char> *)&local_248);
  local_2b8._0_8_ = local_270;
  local_2b8._8_8_ = local_278;
  trial::protocol::json::basic_reader<char>::basic_reader
            (&local_248,(view_type *)&local_2b8.__align);
  trial::protocol::json::partial::parse<std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&local_2b8.__align,(partial *)&local_248,
             reader);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                ((basic_variable<std::allocator<char>_> *)&local_2b8.__align);
  boost::detail::test_impl
            ("result.is<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x2ac,"void residue_suite::parse_null()",v);
  local_258._0_4_ = trial::protocol::json::token::symbol::convert(local_248.decoder.current.code);
  local_27c = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","json::token::symbol::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x2ad,"void residue_suite::parse_null()",&local_258,&local_27c);
  eVar1 = trial::protocol::json::detail::basic_decoder<char>::error(&local_248.decoder);
  local_250 = eVar1._M_cat;
  local_258 = CONCAT44(local_258._4_4_,eVar1._M_value);
  local_27c = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::error_code,trial::protocol::json::errc>
            ("reader.error()","json::unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x2ae,"void residue_suite::parse_null()",&local_258,&local_27c);
  local_258 = CONCAT71(local_248.decoder.current.view.tail._1_7_,
                       (char)local_248.decoder.current.view.tail) -
              (long)local_248.decoder.current.view.head;
  local_250 = (error_category *)local_248.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"[\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x2af,"void residue_suite::parse_null()",&local_258,"[");
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                  *)&local_2b8.__align);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&local_248.stack);
  std::__cxx11::string::~string((string *)&local_278);
  return;
}

Assistant:

void parse_null()
{
    // Trailing whitespace
    {
        std::string input = "null ";
        auto result = json::parse(input);
        TRIAL_PROTOCOL_TEST(result.same<nullable>());
    }
    // Trailing separator
    {
        std::string input = "null,";
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(json::parse(input),
                                        json::error,
                                        "unexpected token");
    }
    // Trailing value
    {
        std::string input = "null true";
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(json::parse(input),
                                        json::error,
                                        "unexpected token");
    }
    // Trailing string
    {
        std::string input = "null\"zulu\"";
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(json::parse(input),
                                        json::error,
                                        "unexpected token");
    }
    // Trailing array
    {
        std::string input = "null[]";
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(json::parse(input),
                                        json::error,
                                        "unexpected token");
    }
    // Trailing object
    {
        std::string input = "null{}";
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(json::parse(input),
                                        json::error,
                                        "unexpected token");
    }
    // Partial
    {
        std::string input = "null[]";
        json::reader reader(input);
        auto result = json::partial::parse(reader);
        TRIAL_PROTOCOL_TEST(result.is<nullable>());
        TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), json::token::symbol::error);
        TRIAL_PROTOCOL_TEST_EQUAL(reader.error(), json::unexpected_token);
        TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "[");
    }
}